

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall PDA::Transducer::Generator::writeFunctions(Generator *this,wostream *stream)

{
  pointer pIVar1;
  uint uVar2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar3;
  wostream *pwVar4;
  wchar_t suff;
  undefined8 in_RCX;
  long lVar5;
  wchar_t in_R8D;
  size_t i;
  ulong uVar6;
  pointer this_00;
  Register local_88;
  wstring local_78;
  wstring local_58;
  Generator *local_38;
  
  pvVar3 = Tokenizer::identifiers(this->m_tokenizer);
  this_00 = (pvVar3->
            super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  while( true ) {
    pvVar3 = Tokenizer::identifiers(this->m_tokenizer);
    suff = (wchar_t)in_RCX;
    if (this_00 ==
        (pvVar3->
        super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
        )._M_impl.super__Vector_impl_data._M_finish) break;
    if (this_00->type == Function) {
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_78,L"Function begin",(allocator<wchar_t> *)&local_88);
      comment(&local_58,&local_78);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      std::__cxx11::wstring::~wstring((wstring *)&local_78);
      hash(&local_58,&this_00->decoratedName);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      pwVar4 = std::operator<<(pwVar4,L':');
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      local_78._M_dataplus._M_p._0_1_ = 1;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_2_ = 0x51;
      local_78._M_string_length._2_1_ = 0;
      local_78._M_string_length._4_4_ = 0;
      push_abi_cxx11_(&local_58,(Generator *)&local_78,(Register *)0x0,suff);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      local_78._M_dataplus._M_p._0_1_ = 1;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_2_ = 0x52;
      local_78._M_string_length._2_1_ = 0;
      local_78._M_string_length._4_4_ = 0;
      local_88.integer = true;
      local_88.size = Full;
      local_88.argumentIndex = 0x51;
      local_88.isPtr = false;
      local_88.ptrOffset = 0;
      mov_abi_cxx11_(&local_58,(Generator *)&local_78,&local_88,(Register *)0x0,in_R8D);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      if (0 < this_00->rbpOffset) {
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&local_78,L"Space allocate for variables",
                   (allocator<wchar_t> *)&local_88);
        comment(&local_58,&local_78);
        pwVar4 = std::operator<<(stream,(wstring *)&local_58);
        std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
        std::__cxx11::wstring::~wstring((wstring *)&local_58);
        std::__cxx11::wstring::~wstring((wstring *)&local_78);
        uVar2 = Identifier::roundedRbpOffset(this_00);
        local_78._M_dataplus._M_p._0_1_ = 1;
        local_78._M_dataplus._M_p._4_4_ = 0;
        local_78._M_string_length._0_2_ = 0x52;
        local_78._M_string_length._2_1_ = 0;
        local_78._M_string_length._4_4_ = 0;
        sub_abi_cxx11_(&local_58,(Generator *)(ulong)uVar2,(int)&local_78,(Register *)0x0,in_R8D);
        pwVar4 = std::operator<<(stream,(wstring *)&local_58);
        std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
        std::__cxx11::wstring::~wstring((wstring *)&local_58);
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&local_78,L"Arguments copy from registers to variables",
                   (allocator<wchar_t> *)&local_88);
        comment(&local_58,&local_78);
        pwVar4 = std::operator<<(stream,(wstring *)&local_58);
        std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
        std::__cxx11::wstring::~wstring((wstring *)&local_58);
        std::__cxx11::wstring::~wstring((wstring *)&local_78);
        lVar5 = 0x78;
        for (uVar6 = 0;
            pIVar1 = (this_00->functionArgs).
                     super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar6 < (ulong)(((long)(this_00->functionArgs).
                                   super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0xa0
                           ); uVar6 = uVar6 + 1) {
          if (*(int *)((long)pIVar1 + lVar5 + -0x38) == 1) {
            local_78._M_dataplus._M_p._0_1_ = 1;
            local_78._M_dataplus._M_p._4_4_ = 1;
            local_78._M_string_length._0_2_ = (undefined2)uVar6;
            local_78._M_string_length._2_1_ = 0;
            local_78._M_string_length._4_4_ = 0;
            local_88.ptrOffset = *(int *)((long)&(pIVar1->name)._M_dataplus._M_p + lVar5);
            local_88.integer = true;
            local_88.size = Full;
            local_88.argumentIndex = 0x51;
            local_88.isPtr = true;
            mov_abi_cxx11_(&local_58,(Generator *)&local_78,&local_88,(Register *)0x6c,in_R8D);
            pwVar4 = std::operator<<(stream,(wstring *)&local_58);
            std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
            std::__cxx11::wstring::~wstring((wstring *)&local_58);
          }
          lVar5 = lVar5 + 0xa0;
        }
      }
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_78,L"Function body",(allocator<wchar_t> *)&local_88);
      comment(&local_58,&local_78);
      this = local_38;
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      std::__cxx11::wstring::~wstring((wstring *)&local_78);
      writeFunctionBody(this,stream,(long)this_00->tokenIndex);
      local_78._M_dataplus._M_p._0_1_ = 1;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_2_ = 0x51;
      local_78._M_string_length._2_1_ = 0;
      local_78._M_string_length._4_4_ = 0;
      local_88.integer = true;
      local_88.size = Full;
      local_88.argumentIndex = 0x52;
      local_88.isPtr = false;
      local_88.ptrOffset = 0;
      in_RCX = 0;
      mov_abi_cxx11_(&local_58,(Generator *)&local_78,&local_88,(Register *)0x0,in_R8D);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      local_78._M_dataplus._M_p._0_1_ = 1;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_2_ = 0x51;
      local_78._M_string_length._2_1_ = 0;
      local_78._M_string_length._4_4_ = 0;
      pop_abi_cxx11_(&local_58,(Generator *)&local_78,(Register *)0x0,(wchar_t)in_RCX);
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      ret_abi_cxx11_();
      pwVar4 = std::operator<<(stream,(wstring *)&local_58);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
    }
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void Generator::writeFunctions(std::wostream &stream)
{
    for(std::vector<Identifier>::const_iterator identifierIterator = m_tokenizer.identifiers().begin(); identifierIterator != m_tokenizer.identifiers().end(); ++identifierIterator)
    {
        const Identifier &identifier = *identifierIterator;

        if (identifier.type == Identifier::Type::Function)
        {
            stream << comment(L"Function begin") << std::endl;
            stream << hash(identifier.decoratedName) << L':' << std::endl;
            stream << push(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << mov(Register(Register::StackTop, Register::Size::Full), Register(Register::StackBase, Register::Size::Full)) << std::endl;
            if (identifier.rbpOffset > 0)
            {
                stream << comment(L"Space allocate for variables") << std::endl;
                stream << sub( identifier.roundedRbpOffset() , Register(Register::StackTop, Register::Size::Full)) << std::endl;
                stream << comment(L"Arguments copy from registers to variables") << std::endl;
                // copying arguments
                for(size_t i = 0 ; i < identifier.functionArgs.size(); ++i)
                {
                    if (identifier.functionArgs[i].type == Identifier::Type::Integer)
                    {
                        stream << mov(Register(i, Register::Size::Half), Register(Register::StackBase, Register::Size::Full, identifier.functionArgs[i].rbpOffset), L'l') << std::endl;
                    }
                }
            }
            stream << comment(L"Function body") << std::endl;
            writeFunctionBody(stream, static_cast<size_t>(identifier.tokenIndex));
            // function end
            stream << mov(Register(Register::StackBase, Register::Size::Full), Register(Register::StackTop, Register::Size::Full)) << std::endl;
            stream << pop(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << ret() << std::endl;
        }
    }
}